

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TMS320C64xDisassembler.c
# Opt level: O0

DecodeStatus DecodeSide(MCInst *Inst,uint Val,uint64_t Address,void *Decoder)

{
  long lVar1;
  int i;
  MCOperand *op;
  DecodeStatus ret;
  void *Decoder_local;
  uint64_t Address_local;
  uint Val_local;
  MCInst *Inst_local;
  DecodeStatus local_4;
  
  ret = MCDisassembler_Success;
  if (Val == 1) {
    for (i = 0; i < (int)(uint)Inst->size; i = i + 1) {
      lVar1 = (long)i;
      if (Inst->Operands[lVar1].Kind == '\x01') {
        if ((Inst->Operands[lVar1].field_2.RegVal < 0x19) ||
           (0x38 < Inst->Operands[lVar1].field_2.RegVal)) {
          if ((0x38 < Inst->Operands[lVar1].field_2.RegVal) &&
             (Inst->Operands[lVar1].field_2.RegVal < 0x59)) {
            Inst->Operands[lVar1].field_2.RegVal = Inst->Operands[lVar1].field_2.RegVal - 0x20;
          }
        }
        else {
          Inst->Operands[lVar1].field_2.RegVal = Inst->Operands[lVar1].field_2.RegVal + 0x20;
        }
      }
    }
  }
  if (Inst->flat_insn->detail == (cs_detail *)0x0) {
    local_4 = MCDisassembler_Success;
  }
  else {
    if (Val == 0) {
      (Inst->flat_insn->detail->field_6).x86.operands[4].field_1.reg = X86_REG_AH;
    }
    else if (Val == 1) {
      (Inst->flat_insn->detail->field_6).x86.operands[4].field_1.reg = X86_REG_AL;
    }
    else {
      (Inst->flat_insn->detail->field_6).x86.operands[4].field_1.reg = X86_REG_INVALID;
      ret = MCDisassembler_Fail;
    }
    local_4 = ret;
  }
  return local_4;
}

Assistant:

static DecodeStatus DecodeSide(MCInst *Inst, unsigned Val,
		uint64_t Address, void *Decoder)
{
	DecodeStatus ret = MCDisassembler_Success;
	MCOperand *op;
	int i;

	/* This is pretty messy, probably we should find a better way */
	if(Val == 1) {
		for(i = 0; i < Inst->size; i++) {
			op = &Inst->Operands[i];
			if(op->Kind == kRegister) {
				if((op->RegVal >= TMS320C64X_REG_A0) && (op->RegVal <= TMS320C64X_REG_A31))
					op->RegVal = (op->RegVal - TMS320C64X_REG_A0 + TMS320C64X_REG_B0);
				else if((op->RegVal >= TMS320C64X_REG_B0) && (op->RegVal <= TMS320C64X_REG_B31))
					op->RegVal = (op->RegVal - TMS320C64X_REG_B0 + TMS320C64X_REG_A0);
			}
		}
	}

	if(!Inst->flat_insn->detail)
		return MCDisassembler_Success;

	switch(Val) {
		case 0:
			Inst->flat_insn->detail->tms320c64x.funit.side = 1;
			break;
		case 1:
			Inst->flat_insn->detail->tms320c64x.funit.side = 2;
			break;
		default:
			Inst->flat_insn->detail->tms320c64x.funit.side = 0;
			ret = MCDisassembler_Fail;
			break;
	}

	return ret;
}